

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O0

int mbedtls_platform_entropy_poll(void *data,uchar *output,size_t len,size_t *olen)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int ret;
  size_t read_len;
  FILE *file;
  size_t *olen_local;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  if (has_getrandom == -1) {
    iVar1 = check_version_3_17_plus();
    has_getrandom = (int)(iVar1 == 0);
  }
  if (has_getrandom == 0) {
    *olen = 0;
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) {
      data_local._4_4_ = -0x3c;
    }
    else {
      sVar2 = fread(output,1,len,__stream);
      if (sVar2 == len) {
        fclose(__stream);
        *olen = len;
        data_local._4_4_ = 0;
      }
      else {
        fclose(__stream);
        data_local._4_4_ = -0x3c;
      }
    }
  }
  else {
    iVar1 = getrandom_wrapper(output,len,0);
    if (iVar1 < 0) {
      data_local._4_4_ = -0x3c;
    }
    else {
      *olen = (long)iVar1;
      data_local._4_4_ = 0;
    }
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_platform_entropy_poll( void *data,
                           unsigned char *output, size_t len, size_t *olen )
{
    FILE *file;
    size_t read_len;
    ((void) data);

#if defined(HAVE_GETRANDOM)
    if( has_getrandom == -1 )
        has_getrandom = ( check_version_3_17_plus() == 0 );

    if( has_getrandom )
    {
        int ret;

        if( ( ret = getrandom_wrapper( output, len, 0 ) ) < 0 )
            return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

        *olen = ret;
        return( 0 );
    }
#endif /* HAVE_GETRANDOM */

    *olen = 0;

    file = fopen( "/dev/urandom", "rb" );
    if( file == NULL )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

    read_len = fread( output, 1, len, file );
    if( read_len != len )
    {
        fclose( file );
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );
    }

    fclose( file );
    *olen = len;

    return( 0 );
}